

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute_PDU.cpp
# Opt level: O2

KBOOL __thiscall KDIS::PDU::Attribute_PDU::operator==(Attribute_PDU *this,Attribute_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  
  KVar1 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if ((((!KVar1) &&
       (KVar1 = DATA_TYPE::SimulationIdentifier::operator!=
                          (&this->m_OrigSimAddr,&Value->m_OrigSimAddr), !KVar1)) &&
      (this->m_ui8ExtPDUType == Value->m_ui8ExtPDUType)) &&
     (((this->m_ui8ExtProtocolVersion == Value->m_ui8ExtProtocolVersion &&
       (this->m_ui32MasterRecType == Value->m_ui32MasterRecType)) &&
      ((this->m_ui8ActionCode == Value->m_ui8ActionCode &&
       (this->m_ui16NumAttrRecSets == Value->m_ui16NumAttrRecSets)))))) {
    bVar2 = std::operator!=(&this->m_vAttributeRecordSets,&Value->m_vAttributeRecordSets);
    return !bVar2;
  }
  return false;
}

Assistant:

KBOOL Attribute_PDU::operator == ( const Attribute_PDU & Value ) const
{
    if( Header::operator        !=( Value ) )                      return false;
    if( m_OrigSimAddr           != Value.m_OrigSimAddr )           return false;
    if( m_ui8ExtPDUType         != Value.m_ui8ExtPDUType )         return false;
    if( m_ui8ExtProtocolVersion != Value.m_ui8ExtProtocolVersion ) return false;
    if( m_ui32MasterRecType     != Value.m_ui32MasterRecType )     return false;
    if( m_ui8ActionCode         != Value.m_ui8ActionCode )         return false;
    if( m_ui16NumAttrRecSets    != Value.m_ui16NumAttrRecSets )    return false;
    if( m_vAttributeRecordSets  != Value.m_vAttributeRecordSets )  return false;
    return true;
}